

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGRect::parse(SVGRect *this,string_view input)

{
  bool bVar1;
  undefined1 local_38 [8];
  Rect value;
  SVGRect *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGRect *)input._M_len;
  value._8_8_ = this;
  Rect::Rect((Rect *)local_38);
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  bVar1 = parseNumber<float>((string_view *)&this_local,(float *)local_38);
  if (((((bVar1) && (bVar1 = skipOptionalSpacesOrComma((string_view *)&this_local), bVar1)) &&
       (bVar1 = parseNumber<float>((string_view *)&this_local,(float *)(local_38 + 4)), bVar1)) &&
      ((bVar1 = skipOptionalSpacesOrComma((string_view *)&this_local), bVar1 &&
       (bVar1 = parseNumber<float>((string_view *)&this_local,&value.x), bVar1)))) &&
     ((bVar1 = skipOptionalSpacesOrComma((string_view *)&this_local), bVar1 &&
      ((bVar1 = parseNumber<float>((string_view *)&this_local,&value.y), bVar1 &&
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local), bVar1))
      )))) {
    if ((value.x < 0.0) || (value.y < 0.0)) {
      input_local._M_str._7_1_ = false;
    }
    else {
      *(undefined1 (*) [8])&(this->super_SVGProperty).field_0xc = local_38;
      *(ulong *)&this->field_0x14 = CONCAT44(value.y,value.x);
      input_local._M_str._7_1_ = true;
    }
  }
  else {
    input_local._M_str._7_1_ = false;
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool SVGRect::parse(std::string_view input)
{
    Rect value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.y)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.w)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.h)
        || !input.empty()) {
        return false;
    }

    if(value.w < 0.f || value.h < 0.f)
        return false;
    m_value = value;
    return true;
}